

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_map_union.hh
# Opt level: O0

void avro::codec_traits<umu::_union_map_union_Union__1__>::encode
               (Encoder *e,_union_map_union_Union__1__ *v)

{
  size_t sVar1;
  _union_map_union_Union__1__ *in_RSI;
  Encoder *in_RDI;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3>_>_>
  *in_stack_ffffffffffffff78;
  _union_map_union_Union__1__ *in_stack_ffffffffffffffd8;
  
  sVar1 = umu::_union_map_union_Union__1__::idx(in_RSI);
  (**(code **)(*(long *)in_RDI + 0xa0))(in_RDI,sVar1);
  sVar1 = umu::_union_map_union_Union__1__::idx(in_RSI);
  if (sVar1 == 0) {
    umu::_union_map_union_Union__1__::get_map_abi_cxx11_(in_stack_ffffffffffffffd8);
    encode<std::map<std::__cxx11::string,umu::r3,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,umu::r3>>>>
              (in_RDI,in_stack_ffffffffffffff78);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3>_>_>
            *)0x2cfcee);
  }
  else if (sVar1 == 1) {
    (**(code **)(*(long *)in_RDI + 0x20))();
  }
  return;
}

Assistant:

static void encode(Encoder& e, umu::_union_map_union_Union__1__ v) {
        e.encodeUnionIndex(v.idx());
        switch (v.idx()) {
        case 0:
            avro::encode(e, v.get_map());
            break;
        case 1:
            e.encodeNull();
            break;
        }
    }